

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor.cpp
# Opt level: O2

uint8_t * cbor_text_skip(uint8_t *in,uint8_t *in_max,int64_t val,int *err)

{
  byte bVar1;
  uint8_t *puVar2;
  int iVar3;
  int64_t val_1;
  
  if (val != -1) {
    puVar2 = in + val;
    if (in_max < puVar2 || val < 0) {
      *err = -3;
      puVar2 = (uint8_t *)0x0;
    }
    return puVar2;
  }
LAB_00182ee5:
  if (in_max <= in) {
    return in;
  }
  if (in == (byte *)0x0) {
    return (uint8_t *)0x0;
  }
  bVar1 = *in;
  if (bVar1 == 0xff) {
    return in + 1;
  }
  puVar2 = cbor_get_number(in,in_max,&val_1);
  if (puVar2 != (uint8_t *)0x0) goto code_r0x00182f10;
  iVar3 = (int)val_1;
  goto LAB_00182f37;
code_r0x00182f10:
  iVar3 = -3;
  if ((val_1 < 0) || (in = puVar2 + val_1, in_max < in || (bVar1 & 0xe0) != 0x60)) {
LAB_00182f37:
    *err = iVar3;
    in = (byte *)0x0;
  }
  goto LAB_00182ee5;
}

Assistant:

uint8_t* cbor_text_skip(uint8_t* in, uint8_t const* in_max, int64_t val, int* err)
{
    if (val == CBOR_END_OF_ARRAY) {
        while (in < in_max && in != NULL) {
            if (*in == CBOR_END_MARK) {
                in++;
                break;
            }
            else {
                int64_t val;
                int cbor_class = CBOR_CLASS(*in);

                in = cbor_get_number(in, in_max, &val);

                if (in == NULL) {
                    *err = (int)val;
                }
                else if (val < 0 || in + val > in_max || cbor_class != CBOR_T_TEXT) {
                    *err = CBOR_MALFORMED_VALUE;
                    in = NULL;
                }
                else if (val > 0) {
                    in += val;
                }
            }
        }
    }
    else {
        if (val < 0 || in + val > in_max) {
            *err = CBOR_MALFORMED_VALUE;
            in = NULL;
        }
        else if (val > 0) {
            in += val;
        }
    }
    return in;
}